

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O2

void qtree_bitins(uchar *a,int nx,int ny,int *b,int n,int bit)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  byte *pbVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint *puVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  
  uVar13 = 1 << ((byte)bit & 0x1f);
  uVar15 = CONCAT44(uVar13,uVar13);
  iVar6 = 0;
  uVar3 = 0;
  iVar7 = 0;
  iVar9 = n;
  do {
    uVar4 = (ulong)iVar6;
    lVar1 = (long)(int)uVar3;
    if (nx + -1 <= iVar7) {
      if (iVar7 < nx) {
        lVar8 = uVar4 << 0x20;
        pbVar10 = a + lVar1;
        lVar1 = lVar1 << 0x20;
        uVar3 = uVar4;
        for (lVar12 = 0; (int)lVar12 < ny + -1; lVar12 = lVar12 + 2) {
          if (*pbVar10 - 4 < 0xc) {
            uVar15 = lVar12 + uVar4;
            switch((uint)*pbVar10) {
            default:
              uVar15 = uVar3 | 1;
              break;
            case 8:
            case 9:
            case 10:
            case 0xb:
              break;
            case 0xc:
            case 0xd:
            case 0xe:
            case 0xf:
              b[uVar4 + lVar12 + 1] = b[uVar4 + lVar12 + 1] | uVar13;
            }
            b[uVar15] = b[uVar15] | uVar13;
          }
          uVar3 = uVar3 + 2;
          lVar8 = lVar8 + 0x200000000;
          lVar1 = lVar1 + 0x100000000;
          pbVar10 = pbVar10 + 1;
        }
        if (((int)lVar12 < ny) && ((a[lVar1 >> 0x20] & 0xf8) == 8)) {
          puVar14 = (uint *)((long)b + (lVar8 >> 0x1e));
          *puVar14 = *puVar14 | uVar13;
        }
      }
      return;
    }
    lVar8 = uVar4 << 0x20;
    lVar12 = (long)n;
    lVar2 = lVar1 << 0x20;
    lVar11 = 0;
    lVar16 = 4;
    uVar5 = uVar4;
    for (iVar17 = 0; iVar17 < ny + -1; iVar17 = iVar17 + 2) {
      if (0xe < a[lVar11 + lVar1] - 1) goto LAB_001730fe;
      puVar14 = (uint *)(b + uVar5 + 1);
      switch((uint)a[lVar11 + lVar1]) {
      case 1:
        puVar14 = (uint *)((long)b + lVar16 + uVar4 * 4 + lVar12 * 4);
        break;
      case 2:
        puVar14 = (uint *)(b + (long)n + uVar5);
        break;
      case 3:
        puVar14 = (uint *)(b + (long)n + uVar5);
      case 5:
        b[lVar12 + uVar4 + lVar11 * 2 + 1] = b[lVar12 + uVar4 + lVar11 * 2 + 1] | uVar13;
        break;
      case 6:
        b[lVar12 + uVar4 + lVar11 * 2] = b[lVar12 + uVar4 + lVar11 * 2] | uVar13;
        break;
      case 7:
        *(ulong *)(b + lVar12 + uVar4 + lVar11 * 2) =
             *(ulong *)(b + lVar12 + uVar4 + lVar11 * 2) | uVar15;
        break;
      case 8:
        goto switchD_001730a2_caseD_8;
      case 9:
        b[lVar12 + uVar4 + lVar11 * 2 + 1] = b[lVar12 + uVar4 + lVar11 * 2 + 1] | uVar13;
        goto switchD_001730a2_caseD_8;
      case 10:
        b[lVar12 + uVar4 + lVar11 * 2] = b[lVar12 + uVar4 + lVar11 * 2] | uVar13;
        goto switchD_001730a2_caseD_8;
      case 0xb:
        *(ulong *)(b + lVar12 + uVar4 + lVar11 * 2) =
             *(ulong *)(b + lVar12 + uVar4 + lVar11 * 2) | uVar15;
        goto switchD_001730a2_caseD_8;
      case 0xc:
        goto switchD_001730a2_caseD_c;
      case 0xd:
        b[lVar12 + uVar4 + lVar11 * 2 + 1] = b[lVar12 + uVar4 + lVar11 * 2 + 1] | uVar13;
        goto switchD_001730a2_caseD_c;
      case 0xe:
        b[lVar12 + uVar4 + lVar11 * 2] = b[lVar12 + uVar4 + lVar11 * 2] | uVar13;
        goto switchD_001730a2_caseD_c;
      case 0xf:
        *(ulong *)(b + lVar12 + uVar4 + lVar11 * 2) =
             *(ulong *)(b + lVar12 + uVar4 + lVar11 * 2) | uVar15;
switchD_001730a2_caseD_c:
        b[uVar4 + lVar11 * 2 + 1] = b[uVar4 + lVar11 * 2 + 1] | uVar13;
switchD_001730a2_caseD_8:
        puVar14 = (uint *)(b + uVar5);
      }
      *puVar14 = *puVar14 | uVar13;
LAB_001730fe:
      uVar5 = uVar5 + 2;
      lVar8 = lVar8 + 0x200000000;
      lVar11 = lVar11 + 1;
      lVar16 = lVar16 + 8;
      lVar2 = lVar2 + 0x100000000;
    }
    if (iVar17 < ny) {
      switch(a[lVar2 >> 0x20]) {
      case '\x02':
      case '\x03':
      case '\x06':
      case '\a':
        lVar8 = (long)(iVar17 + iVar9) * 4;
        break;
      default:
        goto switchD_0017318f_caseD_4;
      case '\n':
      case '\v':
      case '\x0e':
      case '\x0f':
        b[iVar17 + iVar9] = b[iVar17 + iVar9] | uVar13;
      case '\b':
      case '\t':
      case '\f':
      case '\r':
        lVar8 = lVar8 >> 0x1e;
      }
      *(uint *)(lVar8 + (long)b) = *(uint *)(lVar8 + (long)b) | uVar13;
switchD_0017318f_caseD_4:
      uVar3 = (ulong)((int)uVar3 + (int)lVar11 + 1);
    }
    else {
      uVar3 = (uVar3 & 0xffffffff) + lVar11;
    }
    iVar7 = iVar7 + 2;
    iVar6 = iVar6 + n * 2;
    iVar9 = iVar9 + n * 2;
  } while( true );
}

Assistant:

static void
qtree_bitins(unsigned char a[], int nx, int ny, int b[], int n, int bit)
/*
   int n;		declared y dimension of b
*/
{
int i, j, k;
int s00;
int plane_val;

	plane_val = 1 << bit;
	
	/*
	 * expand each 2x2 block
	 */
	k = 0;						/* k   is index of a[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;				/* s00 is index of b[i,j]	*/

  /* Note:
     this code appears to run very slightly faster on a 32-bit linux
     machine using s00+n rather than the s10 intermediate variable
  */
  /*		s10 = s00+n;	*/			/* s10 is index of b[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			b[s00+n+1] |= plane_val;
			break;
		    case(2):
			b[s00+n  ] |= plane_val;
			break;
		    case(3):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			break;
		    case(4):
			b[s00+1] |= plane_val;
			break;
		    case(5):
			b[s00+n+1] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(6):
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(7):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00+n+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00+n+1] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s10+1] |= ( a[k]     & 1) << bit;
			b[s10  ] |= ((a[k]>>1) & 1) << bit;
			b[s00+1] |= ((a[k]>>2) & 1) << bit;
			b[s00  ] |= ((a[k]>>3) & 1) << bit;
*/
			s00 += 2;
/*			s10 += 2; */
			k += 1;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1, s10+1 are off edge
			 */

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			b[s00+n  ] |= plane_val;
			break;
		    case(3):
			b[s00+n  ] |= plane_val;
			break;
		    case(4):
			break;
		    case(5):
			break;
		    case(6):
			b[s00+n  ] |= plane_val;
			break;
		    case(7):
			b[s00+n  ] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s10  ] |= ((a[k]>>1) & 1) << bit;
			b[s00  ] |= ((a[k]>>3) & 1) << bit;
*/
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10, s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			break;
		    case(3):
			break;
		    case(4):
			b[s00+1] |= plane_val;
			break;
		    case(5):
			b[s00+1] |= plane_val;
			break;
		    case(6):
			b[s00+1] |= plane_val;
			break;
		    case(7):
			b[s00+1] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s00+1] |= ((a[k]>>2) & 1) << bit;
			b[s00  ] |= ((a[k]>>3) & 1) << bit;
*/

			s00 += 2;
			k += 1;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			break;
		    case(3):
			break;
		    case(4):
			break;
		    case(5):
			break;
		    case(6):
			break;
		    case(7):
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s00  ] |= ((a[k]>>3) & 1) << bit;
*/
			k += 1;
		}
	}
}